

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::setRange
          (DateTimePickerPrivate *this,QDateTime *min,QDateTime *max)

{
  bool bVar1;
  QDateTime *max_local;
  QDateTime *min_local;
  DateTimePickerPrivate *this_local;
  
  bVar1 = ::operator!=(&this->minimum,min);
  if ((bVar1) || (bVar1 = ::operator!=(&this->maximum,max), bVar1)) {
    QDateTime::operator=(&this->minimum,min);
    QDateTime::operator=(&this->maximum,max);
    bVar1 = operator<(&this->value,&this->minimum);
    if (bVar1) {
      QDateTime::operator=(&this->value,&this->minimum);
    }
    else {
      bVar1 = operator>(&this->value,&this->maximum);
      if (bVar1) {
        QDateTime::operator=(&this->value,&this->maximum);
      }
    }
    fillValues(this,true);
    QWidget::updateGeometry();
    QWidget::update();
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::setRange( const QDateTime & min, const QDateTime & max )
{
	if( minimum != min || maximum != max )
	{
		minimum = min;
		maximum = max;

		if( value < minimum )
			value = minimum;
		else if( value > maximum )
			value = maximum;

		fillValues();

		q->updateGeometry();
		q->update();
	}
}